

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::checkAttDerivationOK
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *baseTypeInfo,
          ComplexTypeInfo *childTypeInfo)

{
  DefAttTypes DVar1;
  uint uVar2;
  SchemaAttDef *baseAttWildCard;
  long lVar3;
  XMLCh *baseName;
  DatatypeValidator *pDVar4;
  bool bVar5;
  int iVar6;
  TraverseSchema *pTVar7;
  ulong uVar8;
  long lVar9;
  SchemaAttDef *pSVar10;
  TraverseSchema *this_00;
  XMLSize_t i;
  ulong uVar11;
  int iStackY_80;
  
  pTVar7 = (TraverseSchema *)ComplexTypeInfo::getAttDefList(childTypeInfo);
  baseAttWildCard = baseTypeInfo->fAttWildCard;
  uVar11 = 0;
  do {
    this_00 = pTVar7;
    uVar8 = (**(code **)(*(long *)pTVar7 + 0x50))();
    if (uVar8 <= uVar11) {
      pSVar10 = childTypeInfo->fAttWildCard;
      if (pSVar10 == (SchemaAttDef *)0x0) {
        return;
      }
      if (baseAttWildCard == (SchemaAttDef *)0x0) {
        iStackY_80 = 0x72;
      }
      else {
        bVar5 = isWildCardSubset(this_00,baseAttWildCard,pSVar10);
        if (bVar5) {
          if ((baseAttWildCard->super_XMLAttDef).fDefaultType <=
              (pSVar10->super_XMLAttDef).fDefaultType) {
            return;
          }
          iStackY_80 = 0x75;
        }
        else {
          iStackY_80 = 0x73;
        }
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iStackY_80);
      return;
    }
    lVar9 = (**(code **)(*(long *)pTVar7 + 0x58))(pTVar7,uVar11);
    lVar3 = *(long *)(lVar9 + 0x48);
    baseName = *(XMLCh **)(lVar3 + 0x30);
    pSVar10 = ComplexTypeInfo::getAttDef(baseTypeInfo,baseName,*(int *)(lVar3 + 0x20));
    if (pSVar10 == (SchemaAttDef *)0x0) {
      iVar6 = 0x71;
      if (baseAttWildCard != (SchemaAttDef *)0x0) {
        bVar5 = wildcardAllowsNamespace(this,baseAttWildCard,*(uint *)(lVar3 + 0x20));
        iVar6 = 0x71;
LAB_0031e91d:
        if (bVar5 != false) goto LAB_0031e947;
      }
LAB_0031e922:
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar6,baseName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      DVar1 = (pSVar10->super_XMLAttDef).fDefaultType;
      uVar2 = *(uint *)(lVar9 + 8);
      if ((DVar1 == DefAttTypes_Max) && (uVar2 != 8)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x74,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (((DVar1 & Required) != DefAttTypes_Min) && ((uVar2 & 2) == 0)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6e,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (uVar2 != 8) {
        pDVar4 = pSVar10->fDatatypeValidator;
        if ((pDVar4 == (DatatypeValidator *)0x0) ||
           (iVar6 = (*(pDVar4->super_XSerializable)._vptr_XSerializable[9])
                              (pDVar4,*(undefined8 *)(lVar9 + 0x50)), (char)iVar6 == '\0')) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6f,baseName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        if ((DVar1 & Fixed) != DefAttTypes_Min) {
          iVar6 = 0x70;
          if ((uVar2 & 1) != 0) {
            bVar5 = XMLString::equals((pSVar10->super_XMLAttDef).fValue,*(XMLCh **)(lVar9 + 0x20));
            iVar6 = 0x70;
            goto LAB_0031e91d;
          }
          goto LAB_0031e922;
        }
      }
    }
LAB_0031e947:
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void TraverseSchema::checkAttDerivationOK(const DOMElement* const elem,
                                          const ComplexTypeInfo* const baseTypeInfo,
                                          const ComplexTypeInfo* const childTypeInfo) {

    SchemaAttDefList& childAttList = (SchemaAttDefList&) childTypeInfo->getAttDefList();
    const SchemaAttDef* baseAttWildCard = baseTypeInfo->getAttWildCard();

    for (XMLSize_t i=0; i<childAttList.getAttDefCount(); i++) {

        SchemaAttDef& childAttDef = (SchemaAttDef&) childAttList.getAttDef(i);
        QName* childAttName = childAttDef.getAttName();
        const XMLCh* childLocalPart = childAttName->getLocalPart();
        const SchemaAttDef* baseAttDef = baseTypeInfo->getAttDef(childLocalPart, childAttName->getURI());

        if (baseAttDef) {

            XMLAttDef::DefAttTypes baseAttDefType = baseAttDef->getDefaultType();
            XMLAttDef::DefAttTypes childAttDefType = childAttDef.getDefaultType();

            // Constraint 2.1.1 & 3 + check for prohibited base attribute
            if (baseAttDefType == XMLAttDef::Prohibited
                && childAttDefType != XMLAttDef::Prohibited) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_8, childLocalPart);
            }

            if ((baseAttDefType & XMLAttDef::Required)
                && !(childAttDefType & XMLAttDef::Required)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_2, childLocalPart);
            }

            // if the attribute in the derived type is prohibited, and it didn't try to override a required attribute,
            // it's ok and shouldn't be tested for data type or fixed value
            if (childAttDefType == XMLAttDef::Prohibited)
                continue;

            // Constraint 2.1.2
            DatatypeValidator* baseDV = baseAttDef->getDatatypeValidator();
            DatatypeValidator* childDV = childAttDef.getDatatypeValidator();
            if (!baseDV || !baseDV->isSubstitutableBy(childDV)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_3, childLocalPart);
            }

            // Constraint 2.1.3
            if ((baseAttDefType & XMLAttDef::Fixed) &&
                (!(childAttDefType & XMLAttDef::Fixed) ||
                 !XMLString::equals(baseAttDef->getValue(), childAttDef.getValue()))) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_4, childLocalPart);
            }
        }
        // Constraint 2.2
        else if (!baseAttWildCard ||
                 !wildcardAllowsNamespace(baseAttWildCard, childAttName->getURI())) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_5, childLocalPart);
        }
    }

    // Constraint 4
    const SchemaAttDef* childAttWildCard = childTypeInfo->getAttWildCard();

    if (childAttWildCard) {

        if (!baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_6);
        }
        else if (!isWildCardSubset(baseAttWildCard, childAttWildCard)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_7);
        }
        else if (childAttWildCard->getDefaultType() < baseAttWildCard->getDefaultType()) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_9);
        }
    }
}